

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void literal(_Bool canAssign)

{
  if (parser.previous.type == TOKEN_FALSE) {
    emitByte('\0');
  }
  else if (parser.previous.type == TOKEN_NIL) {
    emitByte('\0');
  }
  else if (parser.previous.type == TOKEN_TRUE) {
    emitByte('\0');
  }
  return;
}

Assistant:

static void literal(bool canAssign) {
    switch (parser.previous.type) {
        case TOKEN_FALSE:
            emitByte(OP_FALSE);
            break;
        case TOKEN_NIL:
            emitByte(OP_NIL);
            break;
        case TOKEN_TRUE:
            emitByte(OP_TRUE);
            break;
        default:
            return; // Unreachable.
    }
}